

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MercuryData.h
# Opt level: O0

istream * operator>>(istream *in,MercuryTimeStep<2UL> *step)

{
  void *this;
  double *in_RSI;
  istream *in_RDI;
  size_t i;
  ulong local_18;
  
  this = (void *)std::istream::operator>>(in_RDI,(ulong *)(in_RSI + 2));
  std::istream::operator>>(this,in_RSI);
  for (local_18 = 0; local_18 < 2; local_18 = local_18 + 1) {
    std::istream::operator>>(in_RDI,in_RSI + local_18 + 3);
  }
  for (local_18 = 0; local_18 < 2; local_18 = local_18 + 1) {
    std::istream::operator>>(in_RDI,in_RSI + local_18 + 5);
  }
  return in_RDI;
}

Assistant:

std::istream& operator>>(std::istream& in, MercuryTimeStep<NDIMS>& step)
{
  std::size_t i;
  in >> step.numParticles_ >> step.time_;
  
  for (i = 0; i < NDIMS; i++)
    in >> step.min_[i];
    
  for (i = 0; i < NDIMS; i++)
    in >> step.max_[i];

  return in;
}